

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19174::AckermannTask::provideValue
          (AckermannTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *value)

{
  int *piVar1;
  TaskInterface local_38;
  KeyType local_28;
  
  local_38.ctx = ti.ctx;
  local_38.impl = ti.impl;
  if (inputID == 1) {
    piVar1 = (int *)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    if ((long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)piVar1 != 4) goto LAB_00119f81;
    (this->recursiveResultB).value = *piVar1;
  }
  else {
    if (inputID != 0) {
      __assert_fail("inputID == 1 && \"invalid input ID\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xa8,
                    "virtual void (anonymous namespace)::AckermannTask::provideValue(core::TaskInterface, uintptr_t, const core::KeyType &, const core::ValueType &)"
                   );
    }
    piVar1 = (int *)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    if ((long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)piVar1 != 4) {
LAB_00119f81:
      __assert_fail("value.size() == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0x45,"int32_t (anonymous namespace)::intFromValue(const core::ValueType &)");
    }
    (this->recursiveResultA).value = *piVar1;
    if ((this->m != 0) && (this->n != 0)) {
      (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
                (&local_28,(AckermannKey *)(ulong)(this->m - 1));
      llbuild::core::TaskInterface::request(&local_38,&local_28,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28.key._M_dataplus._M_p != &local_28.key.field_2) {
        operator_delete(local_28.key._M_dataplus._M_p,local_28.key.field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  return;
}

Assistant:

virtual void provideValue(core::TaskInterface ti, uintptr_t inputID,
                            const core::KeyType& key, const core::ValueType& value) override {
    if (inputID == 0) {
      recursiveResultA = value;

      // Request the second recursive result, if needed.
      if (m != 0 && n != 0) {
        ti.request(AckermannKey(m-1, recursiveResultA), 1);
      }
    } else {
      assert(inputID == 1 && "invalid input ID");
      recursiveResultB = value;
    }
  }